

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,duckdb::timestamp_t>
               (char *input_str,timestamp_t *result)

{
  string_t input_00;
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  string_t input;
  undefined4 uStack_1c;
  undefined8 uStack_18;
  
  sVar4 = strlen(input_str);
  uVar3 = (uint)sVar4;
  if (uVar3 < 0xd) {
    uStack_18._4_4_ = 0;
    uStack_1c = 0;
    uStack_18._0_4_ = 0;
    pcVar1 = (char *)0x0;
    if (uVar3 != 0) {
      switchD_012e1ce8::default(&uStack_1c,input_str,(ulong)(uVar3 & 0xf));
      pcVar1 = (char *)CONCAT44(uStack_18._4_4_,(undefined4)uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)input_str;
    pcVar1 = input_str;
  }
  uStack_18._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  uStack_18._0_4_ = SUB84(pcVar1,0);
  input_00.value._4_1_ = (undefined1)uStack_1c;
  input_00.value._5_1_ = uStack_1c._1_1_;
  input_00.value._6_1_ = uStack_1c._2_1_;
  input_00.value._7_1_ = uStack_1c._3_1_;
  input_00.value.pointer.length = uVar3;
  input_00.value._8_4_ = (undefined4)uStack_18;
  input_00.value._12_4_ = uStack_18._4_4_;
  uStack_18 = pcVar1;
  bVar2 = TryCast::Operation<duckdb::string_t,duckdb::timestamp_t>(input_00,result,false);
  return bVar2;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}